

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  buffer<char> *this;
  bool bVar4;
  type tVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  format_error *this_00;
  undefined8 extraout_RDX;
  fp value_00;
  fp y;
  decimal_fp<double> dVar10;
  fp fVar11;
  fp x;
  undefined6 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 local_229;
  size_t local_210;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  fp f;
  char *local_1d0;
  gen_digits_handler handler;
  fp cached_pow;
  fp local_140;
  uint64_t uStack_130;
  fp normalized;
  int cached_exp10;
  int min_exp;
  bool use_dragon;
  int exp;
  appender local_108;
  unsigned_long local_100;
  decimal_fp<double> dec;
  appender local_e8;
  decimal_fp<float> local_dc;
  decimal_fp<float> dec_1;
  char local_ca;
  byte local_c9;
  buffer<char> *pbStack_c8;
  bool fixed;
  buffer<char> *buf_local;
  double dStack_b8;
  int precision_local;
  double value_local;
  float_specs specs_local;
  result result_1;
  char digit_1;
  result result;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  round_direction dir;
  uint64_t divisor;
  ulong uStack_58;
  int precision_offset;
  uint64_t fractional;
  undefined1 auStack_48 [4];
  uint32_t integral;
  fp one;
  uint64_t local_28;
  result local_c;
  
  pbStack_c8 = buf;
  buf_local._4_4_ = precision;
  dStack_b8 = value;
  value_local = (double)specs;
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x929,"value is negative");
  }
  value_local._4_4_ = specs._4_4_;
  local_c9 = specs._4_1_ == '\x02';
  if (value <= 0.0) {
    if ((0 < precision) && ((bool)local_c9)) {
      tVar5 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar5);
      pcVar8 = buffer<char>::data(pbStack_c8);
      fill_n<char,int>(pcVar8,buf_local._4_4_,'0');
      return -buf_local._4_4_;
    }
    local_ca = '0';
    buffer<char>::push_back(buf,&local_ca);
    return 0;
  }
  if ((value_local._4_4_ >> 0x13 & 1) != 0) {
    dec_1 = (decimal_fp<float>)specs;
    iVar6 = snprintf_float<double>(value,precision,specs,buf);
    return iVar6;
  }
  if (precision < 0) {
    if ((value_local._4_4_ >> 0x12 & 1) != 0) {
      local_dc = dragonbox::to_decimal<float>((float)value);
      appender::back_insert_iterator(&local_e8,pbStack_c8);
      write<char,_fmt::v8::appender,_unsigned_int,_0>(local_e8,local_dc.significand);
      return local_dc.exponent;
    }
    dVar10 = dragonbox::to_decimal<double>(value);
    local_100 = dVar10.significand;
    dec.significand._0_4_ = dVar10.exponent;
    appender::back_insert_iterator(&local_108,pbStack_c8);
    write<char,_fmt::v8::appender,_unsigned_long,_0>(local_108,local_100);
    return (int)dec.significand;
  }
  min_exp = 0;
  normalized._12_4_ = 0xffffffc4;
  normalized.e = 0;
  fp::fp<double>(&local_140,value);
  fVar11.f = (ulong)(uint)local_140.e;
  fVar11._8_8_ = extraout_RDX;
  fVar11 = normalize<0>((detail *)local_140.f,fVar11);
  uStack_130 = fVar11.f;
  normalized.f._0_4_ = fVar11.e;
  fVar11 = get_cached_power(-0x7c - (int)normalized.f,&normalized.e);
  x.e = (int)normalized.f;
  x.f = uStack_130;
  y._12_4_ = 0;
  y.f = SUB128(fVar11._0_12_,0);
  y.e = SUB124(fVar11._0_12_,8);
  x._12_4_ = 0;
  fVar11 = operator*(x,y);
  handler._16_8_ = fVar11.f;
  normalized.f._0_4_ = fVar11.e;
  uStack_130 = handler._16_8_;
  local_1d0 = buffer<char>::data(pbStack_c8);
  uVar3 = uStack_130;
  handler.buf._0_4_ = 0;
  handler.buf._4_4_ = buf_local._4_4_;
  handler.size = -normalized.e;
  handler.precision._0_1_ = local_c9 & 1;
  f._8_8_ = uStack_130;
  local_28 = 1;
  one._8_8_ = &local_1d0;
  fp::fp((fp *)auStack_48,1L << (-(char)(int)normalized.f & 0x3fU),(int)normalized.f);
  uVar9 = uVar3 >> (-(char)(undefined4)one.f & 0x3fU);
  fractional._4_4_ = (uint32_t)uVar9;
  if (fractional._4_4_ == 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x2ba,"");
  }
  if ((uVar9 & 0xffffffff) != uVar3 >> (-(char)(undefined4)one.f & 0x3fU)) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                ,699,"");
  }
  uStack_58 = uVar3 & _auStack_48 - 1;
  min_exp = count_digits(fractional._4_4_);
  if ((*(byte *)(one._8_8_ + 0x14) & 1) != 0) {
    iVar6 = min_exp + *(int *)(one._8_8_ + 0x10);
    if ((0 < iVar6) &&
       (iVar1 = *(int *)(one._8_8_ + 0xc), iVar7 = max_value<int>(), iVar7 - iVar6 < iVar1)) {
      this_00 = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this_00,"number is too big");
      __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
    }
    *(int *)(one._8_8_ + 0xc) = iVar6 + *(int *)(one._8_8_ + 0xc);
    if (*(int *)(one._8_8_ + 0xc) < 1) {
      if (*(int *)(one._8_8_ + 0xc) < 0) {
        local_c = done;
      }
      else {
        divmod_integral.integral._4_4_ =
             get_round_direction(*(long *)(basic_impl_data<void>::power_of_10_64 +
                                          (long)(min_exp + -1) * 8) <<
                                 (-(char)(undefined4)one.f & 0x3fU),uVar3 / 10,10);
        if (divmod_integral.integral._4_4_ == unknown) {
          local_c = error;
        }
        else {
          local_229 = 0x31;
          if (divmod_integral.integral._4_4_ != up) {
            local_229 = 0x30;
          }
          lVar2 = *(long *)one._8_8_;
          iVar6 = *(int *)(one._8_8_ + 8);
          *(int *)(one._8_8_ + 8) = iVar6 + 1;
          *(undefined1 *)(lVar2 + iVar6) = local_229;
          local_c = done;
        }
      }
      goto LAB_0014cea4;
    }
  }
  do {
    divmod_integral.integral._0_4_ = 0;
    remainder = (uint64_t)&divmod_integral.integral;
    divmod_integral.digit = (uint32_t *)((long)&fractional + 4);
    switch(min_exp) {
    case 1:
      divmod_integral.integral._0_4_ = fractional._4_4_;
      fractional._4_4_ = 0;
      break;
    case 2:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,10);
      break;
    case 3:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,100);
      break;
    case 4:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,1000);
      break;
    case 5:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,10000);
      break;
    case 6:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,100000);
      break;
    case 7:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,1000000);
      break;
    case 8:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,10000000);
      break;
    case 9:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,100000000);
      break;
    case 10:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                ((anon_class_16_2_fdf32556 *)&remainder,1000000000);
      break;
    default:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x2ff,"invalid number of digits");
    }
    min_exp = min_exp + -1;
    local_c = gen_digits_handler::on_digit
                        ((gen_digits_handler *)one._8_8_,
                         (char)(uint32_t)divmod_integral.integral + '0',
                         *(long *)(basic_impl_data<void>::power_of_10_64 + (long)min_exp * 8) <<
                         (-(char)(undefined4)one.f & 0x3fU),
                         ((ulong)fractional._4_4_ << (-(char)(undefined4)one.f & 0x3fU)) + uStack_58
                         ,1,true);
    if (local_c != more) goto LAB_0014cea4;
  } while (0 < min_exp);
  while( true ) {
    uVar9 = uStack_58 * 10;
    local_28 = local_28 * 10;
    uStack_58 = _auStack_48 - 1 & uVar9;
    min_exp = min_exp + -1;
    specs_local._4_4_ =
         gen_digits_handler::on_digit
                   ((gen_digits_handler *)one._8_8_,
                    (char)(uVar9 >> (-(char)(undefined4)one.f & 0x3fU)) + '0',_auStack_48,uStack_58,
                    local_28,false);
    local_c = specs_local._4_4_;
    if (specs_local._4_4_ != more) break;
    specs_local._4_4_ = 0;
  }
LAB_0014cea4:
  this = pbStack_c8;
  if (local_c == error) {
    min_exp = ((int)handler.buf - normalized.e) + -1 + min_exp;
    buf_local._4_4_ = handler.buf._4_4_;
    fp::fp((fp *)&max_double_digits);
    if ((value_local._4_4_ >> 0x12 & 1) == 0) {
      bVar4 = fp::assign<double,_0>((fp *)&max_double_digits,dStack_b8);
    }
    else {
      bVar4 = fp::assign<float,_0>((fp *)&max_double_digits,(float)dStack_b8);
    }
    if (0x2ff < buf_local._4_4_) {
      buf_local._4_4_ = 0x2ff;
    }
    value_00.f = f.f & 0xffffffff;
    value_00.e._0_1_ = bVar4;
    value_00._9_7_ = 0;
    format_dragon(_max_double_digits,value_00,SUB41(buf_local._4_4_,0),(int)pbStack_c8,
                  (buffer<char> *)&min_exp,
                  (int *)CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8
                                                )));
  }
  else {
    min_exp = handler.size + min_exp;
    tVar5 = to_unsigned<int>((int)handler.buf);
    buffer<char>::try_resize(this,(ulong)tVar5);
  }
  if (((local_c9 & 1) == 0) && ((value_local._4_4_ >> 0x14 & 1) == 0)) {
    local_210 = buffer<char>::size(pbStack_c8);
    while( true ) {
      bVar4 = false;
      if (local_210 != 0) {
        pcVar8 = buffer<char>::operator[]<unsigned_long>(pbStack_c8,local_210 - 1);
        bVar4 = *pcVar8 == '0';
      }
      if (!bVar4) break;
      local_210 = local_210 - 1;
      min_exp = min_exp + 1;
    }
    buffer<char>::try_resize(pbStack_c8,local_210);
  }
  return min_exp;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}